

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_check_dup_typedefs(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *tpdfs_global;
  ulong uVar2;
  lysp_tpdf *plVar3;
  lysp_tpdf *plVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar5 = 0;
  tpdfs_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  uVar6 = 0xffffffffffffffff;
  while( true ) {
    plVar4 = mod->typedefs;
    if (plVar4 == (lysp_tpdf *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)&plVar4[-1].flags;
    }
    uVar6 = uVar6 + 1;
    if (uVar7 <= uVar6) break;
    plVar4 = (lysp_tpdf *)((long)&plVar4->name + lVar5);
    lVar5 = lVar5 + 0xb0;
    LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar4,tpdfs_global);
    if (LVar1 != LY_SUCCESS) goto LAB_001628f8;
  }
  uVar6 = 0;
  while( true ) {
    if (mod->includes == (lysp_include *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(mod->includes[-1].rev + 8);
    }
    if (uVar7 <= uVar6) break;
    uVar7 = 0xffffffffffffffff;
    lVar5 = 0;
    while( true ) {
      plVar4 = (mod->includes[uVar6].submodule)->typedefs;
      if (plVar4 == (lysp_tpdf *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ulong *)&plVar4[-1].flags;
      }
      uVar7 = uVar7 + 1;
      if (uVar2 <= uVar7) break;
      plVar4 = (lysp_tpdf *)((long)&plVar4->name + lVar5);
      lVar5 = lVar5 + 0xb0;
      LVar1 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,plVar4,tpdfs_global);
      if (LVar1 != LY_SUCCESS) goto LAB_001628f8;
    }
    uVar6 = uVar6 + 1;
  }
  if ((ctx->tpdfs_nodes).count == 0) {
    LVar1 = LY_SUCCESS;
  }
  else {
    uVar6 = 0;
    do {
      plVar3 = lysp_node_typedefs((lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar6]);
      uVar7 = 0xffffffffffffffff;
      plVar4 = plVar3;
      while( true ) {
        if (plVar3 == (lysp_tpdf *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ulong *)&plVar3[-1].flags;
        }
        uVar7 = uVar7 + 1;
        if (uVar2 <= uVar7) break;
        LVar1 = lysp_check_dup_typedef
                          (ctx,(lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[uVar6],plVar4,
                           tpdfs_global);
        plVar4 = plVar4 + 1;
        if (LVar1 != LY_SUCCESS) goto LAB_001628f8;
      }
      uVar6 = uVar6 + 1;
      LVar1 = LY_SUCCESS;
    } while (uVar6 < (ctx->tpdfs_nodes).count);
  }
LAB_001628f8:
  lyht_free(tpdfs_global,(_func_void_void_ptr *)0x0);
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_typedefs(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_tpdf *typedefs;
    LY_ARRAY_COUNT_TYPE u, v;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    /* check name collisions - typedefs and groupings */
    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_ARRAY_FOR(mod->typedefs, v) {
        ret = lysp_check_dup_typedef(ctx, NULL, &mod->typedefs[v], ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, v) {
        LY_ARRAY_FOR(mod->includes[v].submodule->typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, NULL, &mod->includes[v].submodule->typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->tpdfs_nodes.count; ++i) {
        typedefs = lysp_node_typedefs((struct lysp_node *)ctx->tpdfs_nodes.objs[i]);
        LY_ARRAY_FOR(typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, (struct lysp_node *)ctx->tpdfs_nodes.objs[i], &typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}